

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O3

void __thiscall MT32Emu::TVP::updatePitch(TVP *this)

{
  bool bVar1;
  Bit16u BVar2;
  Bit32s BVar3;
  ControlROMPCMStruct *pCVar4;
  Synth *pSVar5;
  TVA *this_00;
  uint uVar6;
  uint uVar7;
  
  uVar7 = this->currentPitchOffset + this->basePitch;
  bVar1 = Partial::isPCM(this->partial);
  if (bVar1) {
    pCVar4 = Partial::getControlROMPCMStruct(this->partial);
    if ((pCVar4->len & 1) != 0) goto LAB_001844ec;
  }
  pSVar5 = Partial::getSynth(this->partial);
  BVar3 = Synth::getMasterTunePitchDelta(pSVar5);
  uVar7 = uVar7 + BVar3;
LAB_001844ec:
  if (((this->partialParam->wg).pitchBenderEnabled & 1) != 0) {
    BVar3 = Part::getPitchBend(this->part);
    uVar7 = uVar7 + BVar3;
  }
  pSVar5 = Partial::getSynth(this->partial);
  uVar6 = 0;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  uVar7 = uVar7 & 0xffff;
  if (((uint)*pSVar5->controlROMFeatures & 2) == 0) {
    uVar7 = uVar6;
  }
  BVar2 = (Bit16u)uVar7;
  if (0xe7ff < uVar7) {
    BVar2 = 0xe800;
  }
  this->pitch = BVar2;
  this_00 = Partial::getTVA(this->partial);
  TVA::recalcSustain(this_00);
  return;
}

Assistant:

void TVP::updatePitch() {
	Bit32s newPitch = basePitch + currentPitchOffset;
	if (!partial->isPCM() || (partial->getControlROMPCMStruct()->len & 0x01) == 0) { // FIXME: Use !partial->pcmWaveEntry->unaffectedByMasterTune instead
		// FIXME: There are various bugs not yet emulated
		// 171 is ~half a semitone.
		newPitch += partial->getSynth()->getMasterTunePitchDelta();
	}
	if ((partialParam->wg.pitchBenderEnabled & 1) != 0) {
		newPitch += part->getPitchBend();
	}

	// MT-32 GEN0 does 16-bit calculations here, allowing an integer overflow.
	// This quirk is exploited e.g. in Colonel's Bequest timbres "Lightning" and "SwmpBackgr".
	if (partial->getSynth()->controlROMFeatures->quirkPitchEnvelopeOverflow) {
		newPitch = newPitch & 0xffff;
	} else if (newPitch < 0) {
		newPitch = 0;
	}
	// This check is present in every unit.
	if (newPitch > 59392) {
		newPitch = 59392;
	}
	pitch = Bit16u(newPitch);

	// FIXME: We're doing this here because that's what the CM-32L does - we should probably move this somewhere more appropriate in future.
	partial->getTVA()->recalcSustain();
}